

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall
Assembler::processLdStrMemDir(Assembler *this,string *instruction,int reg,string *operand)

{
  bool bVar1;
  int value;
  Assembler *this_00;
  Assembler *literal;
  string local_90;
  undefined1 local_70 [64];
  
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (operand,&symbolReg_abi_cxx11_,0);
  if (bVar1) {
    literal = (Assembler *)(local_70 + 0x20);
    std::__cxx11::string::string((string *)literal,(string *)operand);
    value = processAbsoluteAddressingSymbol(this,(string *)literal);
  }
  else {
    literal = (Assembler *)local_70;
    this_00 = literal;
    std::__cxx11::string::string((string *)literal,(string *)operand);
    value = literalToDecimal(this_00,(string *)literal);
  }
  std::__cxx11::string::~string((string *)literal);
  std::__cxx11::string::string((string *)&local_90,(string *)instruction);
  instr5Bytes(this,&local_90,reg,4,value);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void Assembler::processLdStrMemDir(string instruction, int reg, string operand) {
    int adr = 0x04;
    int value;

    if (regex_match(operand, symbolReg)) value = processAbsoluteAddressingSymbol(operand);
    else value = literalToDecimal(operand);

    instr5Bytes(instruction, reg, adr, value);
    return;
}